

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

int lj_debug_getinfo(lua_State *L,char *what,lj_Debug *ar,int ext)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  GCstr *str;
  uint64_t uVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  BCLine BVar8;
  uint uVar9;
  char *pcVar10;
  GCtab *t;
  long lVar11;
  TValue *pTVar12;
  uint uVar13;
  ulong uVar14;
  cTValue *frame;
  char cVar15;
  cTValue *nextframe;
  GCfunc *fn;
  
  if (*what == '>') {
    fn = (GCfunc *)L->top[-1].u64;
    uVar14 = (ulong)fn & 0xffff800000000000;
    if (uVar14 == 0xfffb800000000000) {
      fn = (GCfunc *)((ulong)fn & 0x7fffffffffff);
      L->top = L->top + -1;
      what = what + 1;
    }
    nextframe = (cTValue *)0x0;
    if (uVar14 != 0xfffb800000000000) {
      return 0;
    }
    frame = (cTValue *)0x0;
  }
  else {
    uVar13 = ar->i_ci;
    frame = (cTValue *)((L->stack).ptr64 + (ulong)(uVar13 & 0xffff) * 8);
    nextframe = (cTValue *)0x0;
    if (0xffff < uVar13) {
      nextframe = frame + (uVar13 >> 0x10);
    }
    fn = (GCfunc *)(frame[-1].u64 & 0x7fffffffffff);
  }
  bVar7 = false;
  bVar6 = false;
  do {
    bVar1 = *what;
    if (bVar1 < 0x6c) {
      if (bVar1 < 0x53) {
        if (bVar1 != 0x4c) {
          if (bVar1 != 0) {
            return 0;
          }
          if (bVar6) {
            L->top->u64 = (ulong)fn | 0xfffb800000000000;
            pTVar12 = L->top;
            L->top = pTVar12 + 1;
            if ((TValue *)(L->maxstack).ptr64 <= pTVar12 + 1) {
              lj_state_growstack1(L);
            }
          }
          if (bVar7) {
            if ((fn->c).ffid == '\0') {
              t = lj_tab_new(L,0,0);
              lVar11 = *(long *)((long)fn + 0x20);
              lVar5 = *(long *)(lVar11 + -0x18);
              if (lVar5 != 0) {
                cVar15 = '\x01';
                if (0xff < *(int *)(lVar11 + -0x1c)) {
                  cVar15 = (0xffff < *(int *)(lVar11 + -0x1c)) * '\x02' + '\x02';
                }
                uVar13 = *(int *)(lVar11 + -0x5c) - 1;
                if (uVar13 != 0) {
                  iVar2 = *(int *)(lVar11 + -0x20);
                  uVar14 = 0;
                  do {
                    if (cVar15 == '\x02') {
                      uVar9 = (uint)*(ushort *)(lVar5 + uVar14 * 2);
                    }
                    else if (cVar15 == '\x01') {
                      uVar9 = (uint)*(byte *)(lVar5 + uVar14);
                    }
                    else {
                      uVar9 = *(uint *)(lVar5 + uVar14 * 4);
                    }
                    lVar11 = (long)(int)uVar9 + (long)iVar2;
                    uVar9 = (uint)lVar11;
                    if (uVar9 < t->asize) {
                      pTVar12 = (TValue *)(lVar11 * 8 + (t->array).ptr64);
                    }
                    else {
                      pTVar12 = lj_tab_setinth(L,t,uVar9);
                    }
                    pTVar12->u64 = 0xfffeffffffffffff;
                    uVar14 = uVar14 + 1;
                  } while (uVar13 != uVar14);
                }
              }
              L->top->u64 = (ulong)t | 0xfffa000000000000;
            }
            else {
              L->top->u64 = 0xffffffffffffffff;
            }
            pTVar12 = L->top;
            L->top = pTVar12 + 1;
            if ((TValue *)(L->maxstack).ptr64 <= pTVar12 + 1) {
              lj_state_growstack1(L);
              return 1;
            }
            return 1;
          }
          return 1;
        }
        bVar7 = true;
      }
      else if (bVar1 == 0x53) {
        if ((fn->c).ffid == '\0') {
          lVar11 = *(long *)((long)fn + 0x20);
          iVar2 = *(int *)(lVar11 + -0x20);
          str = *(GCstr **)(lVar11 + -0x28);
          ar->source = (char *)(str + 1);
          lj_debug_shortname(ar->short_src,str,iVar2);
          ar->linedefined = iVar2;
          iVar3 = *(int *)(lVar11 + -0x1c);
          ar->lastlinedefined = iVar3 + iVar2;
          pcVar10 = "main";
          if (iVar3 == 0) {
            pcVar10 = "Lua";
          }
          if (iVar2 != 0) {
            pcVar10 = "Lua";
          }
        }
        else {
          ar->source = "=[C]";
          builtin_strncpy(ar->short_src,"[C]",4);
          ar->linedefined = -1;
          ar->lastlinedefined = -1;
          pcVar10 = "C";
        }
        ar->what = pcVar10;
      }
      else {
        bVar6 = true;
        if (bVar1 != 0x66) {
          return 0;
        }
      }
    }
    else if (bVar1 == 0x6c) {
      if (frame == (cTValue *)0x0) {
        BVar8 = -1;
      }
      else {
        BVar8 = debug_frameline(L,fn,nextframe);
      }
      ar->currentline = BVar8;
    }
    else if (bVar1 == 0x6e) {
      if (frame == (cTValue *)0x0) {
        pcVar10 = (char *)0x0;
      }
      else {
        pcVar10 = lj_debug_funcname(L,frame,&ar->name);
      }
      ar->namewhat = pcVar10;
      if (pcVar10 == (char *)0x0) {
        ar->namewhat = "";
        ar->name = (char *)0x0;
      }
    }
    else {
      if (bVar1 != 0x75) {
        return 0;
      }
      ar->nups = (uint)(fn->c).nupvalues;
      if (ext != 0) {
        if ((fn->c).ffid == '\0') {
          uVar4 = (fn->c).pc.ptr64;
          ar->nparams = (uint)*(byte *)(uVar4 - 0x5e);
          ar->isvararg = *(byte *)(uVar4 - 0x2b) >> 1 & 1;
        }
        else {
          ar->nparams = 0;
          ar->isvararg = 1;
        }
      }
    }
    what = (char *)((byte *)what + 1);
  } while( true );
}

Assistant:

int lj_debug_getinfo(lua_State *L, const char *what, lj_Debug *ar, int ext)
{
  int opt_f = 0, opt_L = 0;
  TValue *frame = NULL;
  TValue *nextframe = NULL;
  GCfunc *fn;
  if (*what == '>') {
    TValue *func = L->top - 1;
    if (!tvisfunc(func)) return 0;
    fn = funcV(func);
    L->top--;
    what++;
  } else {
    uint32_t offset = (uint32_t)ar->i_ci & 0xffff;
    uint32_t size = (uint32_t)ar->i_ci >> 16;
    lj_assertL(offset != 0, "bad frame offset");
    frame = tvref(L->stack) + offset;
    if (size) nextframe = frame + size;
    lj_assertL(frame <= tvref(L->maxstack) &&
	       (!nextframe || nextframe <= tvref(L->maxstack)),
	       "broken frame chain");
    fn = frame_func(frame);
    lj_assertL(fn->c.gct == ~LJ_TFUNC, "bad frame function");
  }
  for (; *what; what++) {
    if (*what == 'S') {
      if (isluafunc(fn)) {
	GCproto *pt = funcproto(fn);
	BCLine firstline = pt->firstline;
	GCstr *name = proto_chunkname(pt);
	ar->source = strdata(name);
	lj_debug_shortname(ar->short_src, name, pt->firstline);
	ar->linedefined = (int)firstline;
	ar->lastlinedefined = (int)(firstline + pt->numline);
	ar->what = (firstline || !pt->numline) ? "Lua" : "main";
      } else {
	ar->source = "=[C]";
	ar->short_src[0] = '[';
	ar->short_src[1] = 'C';
	ar->short_src[2] = ']';
	ar->short_src[3] = '\0';
	ar->linedefined = -1;
	ar->lastlinedefined = -1;
	ar->what = "C";
      }
    } else if (*what == 'l') {
      ar->currentline = frame ? debug_frameline(L, fn, nextframe) : -1;
    } else if (*what == 'u') {
      ar->nups = fn->c.nupvalues;
      if (ext) {
	if (isluafunc(fn)) {
	  GCproto *pt = funcproto(fn);
	  ar->nparams = pt->numparams;
	  ar->isvararg = !!(pt->flags & PROTO_VARARG);
	} else {
	  ar->nparams = 0;
	  ar->isvararg = 1;
	}
      }
    } else if (*what == 'n') {
      ar->namewhat = frame ? lj_debug_funcname(L, frame, &ar->name) : NULL;
      if (ar->namewhat == NULL) {
	ar->namewhat = "";
	ar->name = NULL;
      }
    } else if (*what == 'f') {
      opt_f = 1;
    } else if (*what == 'L') {
      opt_L = 1;
    } else {
      return 0;  /* Bad option. */
    }
  }
  if (opt_f) {
    setfuncV(L, L->top, fn);
    incr_top(L);
  }
  if (opt_L) {
    if (isluafunc(fn)) {
      GCtab *t = lj_tab_new(L, 0, 0);
      GCproto *pt = funcproto(fn);
      const void *lineinfo = proto_lineinfo(pt);
      if (lineinfo) {
	BCLine first = pt->firstline;
	int sz = pt->numline < 256 ? 1 : pt->numline < 65536 ? 2 : 4;
	MSize i, szl = pt->sizebc-1;
	for (i = 0; i < szl; i++) {
	  BCLine line = first +
	    (sz == 1 ? (BCLine)((const uint8_t *)lineinfo)[i] :
	     sz == 2 ? (BCLine)((const uint16_t *)lineinfo)[i] :
	     (BCLine)((const uint32_t *)lineinfo)[i]);
	  setboolV(lj_tab_setint(L, t, line), 1);
	}
      }
      settabV(L, L->top, t);
    } else {
      setnilV(L->top);
    }
    incr_top(L);
  }
  return 1;  /* Ok. */
}